

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O2

void __thiscall
capnp::anon_unknown_1::CapnpcCppMain::getTransitiveSuperclasses
          (CapnpcCppMain *this,InterfaceSchema schema,
          map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
          *map)

{
  uint uVar1;
  InterfaceSchema this_00;
  map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
  *map_00;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>,_bool> pVar2;
  Schema local_70;
  undefined1 local_68 [16];
  SuperclassList local_58;
  
  local_70.raw = (RawBrandedSchema *)this;
  Schema::getProto((Reader *)&local_58,&local_70);
  if (local_58.list.reader.elementCount < 0x40) {
    local_68._0_8_ = (SuperclassList *)0x0;
  }
  else {
    local_68._0_8_ = (local_58.list.reader.capTable)->_vptr_CapTableReader;
  }
  local_68._8_8_ = local_70.raw;
  pVar2 = std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,capnp::InterfaceSchema>,std::_Select1st<std::pair<unsigned_long_const,capnp::InterfaceSchema>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,capnp::InterfaceSchema>>>
          ::_M_emplace_unique<std::pair<unsigned_long,capnp::InterfaceSchema>>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,capnp::InterfaceSchema>,std::_Select1st<std::pair<unsigned_long_const,capnp::InterfaceSchema>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,capnp::InterfaceSchema>>>
                      *)schema.super_Schema.raw,
                     (pair<unsigned_long,_capnp::InterfaceSchema> *)local_68);
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    InterfaceSchema::getSuperclasses(&local_58,(InterfaceSchema *)&local_70);
    local_68._8_8_ = local_68._8_8_ & 0xffffffff00000000;
    uVar1 = 0;
    local_68._0_8_ = &local_58;
    while (uVar1 != local_58.list.reader.elementCount) {
      this_00 = _::
                IndexingIterator<const_capnp::InterfaceSchema::SuperclassList,_capnp::InterfaceSchema>
                ::operator*((IndexingIterator<const_capnp::InterfaceSchema::SuperclassList,_capnp::InterfaceSchema>
                             *)local_68);
      getTransitiveSuperclasses((CapnpcCppMain *)this_00.super_Schema.raw,schema,map_00);
      uVar1 = local_68._8_4_ + 1;
      local_68._8_4_ = uVar1;
    }
  }
  return;
}

Assistant:

void getTransitiveSuperclasses(InterfaceSchema schema, std::map<uint64_t, InterfaceSchema>& map) {
    if (map.insert(std::make_pair(schema.getProto().getId(), schema)).second) {
      for (auto sup: schema.getSuperclasses()) {
        getTransitiveSuperclasses(sup, map);
      }
    }
  }